

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O3

void update_box(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,boxptr boxp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  short *psVar17;
  
  iVar14 = *(int *)&nim->pixels;
  iVar15 = *(int *)((long)&nim->pixels + 4);
  iVar8 = nim->sx;
  lVar9 = (long)iVar8;
  iVar6 = nim->sy;
  iVar10 = nim->colorsTotal;
  lVar11 = (long)iVar10;
  iVar7 = nim->red[0];
  if (iVar14 < iVar15) {
    lVar16 = (long)iVar14;
    do {
      if (iVar8 <= iVar6) {
        lVar5 = *(long *)(oim->red + lVar16 * 2 + -5) + lVar9 * 0x40 + lVar11 * 2;
        lVar13 = lVar9;
        do {
          if (iVar10 <= iVar7) {
            lVar4 = 0;
            do {
              if (*(short *)(lVar5 + lVar4 * 2) != 0) {
                iVar14 = (int)lVar16;
                *(int *)&nim->pixels = iVar14;
                goto LAB_00124199;
              }
              lVar4 = lVar4 + 1;
            } while ((iVar7 - iVar10) + 1 != (int)lVar4);
          }
          lVar13 = lVar13 + 1;
          lVar5 = lVar5 + 0x40;
        } while (iVar6 + 1 != (int)lVar13);
      }
      lVar16 = lVar16 + 1;
    } while (iVar15 + 1 != (int)lVar16);
  }
LAB_00124199:
  if (iVar14 < iVar15) {
    lVar16 = (long)iVar15;
    do {
      if (iVar8 <= iVar6) {
        lVar5 = *(long *)(oim->red + lVar16 * 2 + -5) + lVar9 * 0x40 + lVar11 * 2;
        lVar13 = lVar9;
        do {
          if (iVar10 <= iVar7) {
            lVar4 = 0;
            do {
              if (*(short *)(lVar5 + lVar4 * 2) != 0) {
                iVar15 = (int)lVar16;
                *(int *)((long)&nim->pixels + 4) = iVar15;
                goto LAB_00124222;
              }
              lVar4 = lVar4 + 1;
            } while ((iVar7 - iVar10) + 1 != (int)lVar4);
          }
          lVar13 = lVar13 + 1;
          lVar5 = lVar5 + 0x40;
        } while (iVar6 + 1 != (int)lVar13);
      }
      bVar1 = iVar14 < lVar16;
      lVar16 = lVar16 + -1;
    } while (bVar1);
  }
LAB_00124222:
  if (iVar8 < iVar6) {
    lVar16 = lVar9 * 0x40 + lVar11 * 2;
    do {
      lVar13 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar10 <= iVar7) {
            lVar5 = 0;
            do {
              if (*(short *)(*(long *)(oim->red + lVar13 * 2 + -5) + lVar16 + lVar5 * 2) != 0) {
                iVar8 = (int)lVar9;
                nim->sx = iVar8;
                goto LAB_0012429f;
              }
              lVar5 = lVar5 + 1;
            } while ((iVar7 - iVar10) + 1 != (int)lVar5);
          }
          lVar13 = lVar13 + 1;
        } while (iVar15 + 1 != (int)lVar13);
      }
      lVar9 = lVar9 + 1;
      lVar16 = lVar16 + 0x40;
    } while (iVar6 + 1 != (int)lVar9);
  }
LAB_0012429f:
  if (iVar8 < iVar6) {
    lVar9 = (long)iVar6 * 0x40 + lVar11 * 2;
    lVar16 = (long)iVar6;
    do {
      lVar13 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar10 <= iVar7) {
            lVar5 = 0;
            do {
              if (*(short *)(*(long *)(oim->red + lVar13 * 2 + -5) + lVar9 + lVar5 * 2) != 0) {
                iVar6 = (int)lVar16;
                nim->sy = iVar6;
                goto LAB_00124329;
              }
              lVar5 = lVar5 + 1;
            } while ((iVar7 - iVar10) + 1 != (int)lVar5);
          }
          lVar13 = lVar13 + 1;
        } while (iVar15 + 1 != (int)lVar13);
      }
      lVar9 = lVar9 + -0x40;
      bVar1 = iVar8 < lVar16;
      lVar16 = lVar16 + -1;
    } while (bVar1);
  }
LAB_00124329:
  if (iVar10 < iVar7) {
    do {
      lVar9 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar8 <= iVar6) {
            psVar17 = (short *)(*(long *)(oim->red + lVar9 * 2 + -5) + (long)iVar8 * 0x40 +
                               lVar11 * 2);
            iVar12 = (iVar6 - iVar8) + 1;
            do {
              if (*psVar17 != 0) {
                iVar10 = (int)lVar11;
                nim->colorsTotal = iVar10;
                goto LAB_001243a7;
              }
              psVar17 = psVar17 + 0x20;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (iVar15 + 1 != (int)lVar9);
      }
      lVar11 = lVar11 + 1;
    } while (iVar7 + 1 != (int)lVar11);
  }
LAB_001243a7:
  if (iVar10 < iVar7) {
    lVar9 = (long)iVar7;
    do {
      lVar11 = (long)iVar14;
      if (iVar14 <= iVar15) {
        do {
          if (iVar8 <= iVar6) {
            psVar17 = (short *)(*(long *)(oim->red + lVar11 * 2 + -5) + (long)iVar8 * 0x40 +
                               lVar9 * 2);
            iVar12 = (iVar6 - iVar8) + 1;
            do {
              if (*psVar17 != 0) {
                iVar7 = (int)lVar9;
                nim->red[0] = iVar7;
                goto LAB_0012442b;
              }
              psVar17 = psVar17 + 0x20;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          lVar11 = lVar11 + 1;
        } while (iVar15 + 1 != (int)lVar11);
      }
      bVar1 = iVar10 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar1);
  }
LAB_0012442b:
  iVar3 = (iVar15 - iVar14) * 0x10;
  iVar2 = (iVar6 - iVar8) * 0xc;
  iVar12 = (iVar7 - iVar10) * 8;
  nim->red[1] = iVar12 * iVar12 + iVar3 * iVar3 + iVar2 * iVar2;
  if (iVar15 < iVar14) {
    lVar11 = 0;
  }
  else {
    lVar9 = (long)iVar14;
    lVar11 = 0;
    do {
      if (iVar8 <= iVar6) {
        lVar13 = *(long *)(oim->red + lVar9 * 2 + -5) + (long)iVar8 * 0x40 + (long)iVar10 * 2;
        lVar16 = (long)iVar8;
        do {
          if (iVar10 <= iVar7) {
            lVar5 = 0;
            do {
              lVar11 = (lVar11 + 1) - (ulong)(*(short *)(lVar13 + lVar5 * 2) == 0);
              lVar5 = lVar5 + 1;
            } while ((iVar7 - iVar10) + 1 != (int)lVar5);
          }
          lVar16 = lVar16 + 1;
          lVar13 = lVar13 + 0x40;
        } while (iVar6 + 1 != (int)lVar16);
      }
      lVar9 = lVar9 + 1;
    } while (iVar15 + 1 != (int)lVar9);
  }
  *(long *)(nim->red + 3) = lVar11;
  return;
}

Assistant:

LOCAL (void)
update_box (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize, boxptr boxp)
{
	hist3d histogram = cquantize->histogram;
	histptr histp;
	int c0, c1, c2;
	int c0min, c0max, c1min, c1max, c2min, c2max;
	INT32 dist0, dist1, dist2;
	long ccount;
	(void)oim;
	(void)nim;

	c0min = boxp->c0min;
	c0max = boxp->c0max;
	c1min = boxp->c1min;
	c1max = boxp->c1max;
	c2min = boxp->c2min;
	c2max = boxp->c2max;

	if (c0max > c0min)
		for (c0 = c0min; c0 <= c0max; c0++)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0min = c0min = c0;
						goto have_c0min;
					}
			}
have_c0min:
	if (c0max > c0min)
		for (c0 = c0max; c0 >= c0min; c0--)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0max = c0max = c0;
						goto have_c0max;
					}
			}
have_c0max:
	if (c1max > c1min)
		for (c1 = c1min; c1 <= c1max; c1++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1min = c1min = c1;
						goto have_c1min;
					}
			}
have_c1min:
	if (c1max > c1min)
		for (c1 = c1max; c1 >= c1min; c1--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1max = c1max = c1;
						goto have_c1max;
					}
			}
have_c1max:
	if (c2max > c2min)
		for (c2 = c2min; c2 <= c2max; c2++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2min = c2min = c2;
						goto have_c2min;
					}
			}
have_c2min:
	if (c2max > c2min)
		for (c2 = c2max; c2 >= c2min; c2--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2max = c2max = c2;
						goto have_c2max;
					}
			}
have_c2max:

	/* Update box volume.
	 * We use 2-norm rather than real volume here; this biases the method
	 * against making long narrow boxes, and it has the side benefit that
	 * a box is splittable iff norm > 0.
	 * Since the differences are expressed in histogram-cell units,
	 * we have to shift back to JSAMPLE units to get consistent distances;
	 * after which, we scale according to the selected distance scale factors.
	 */
	dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
	dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
	dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
	boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

	/* Now scan remaining volume of box and compute population */
	ccount = 0;
	for (c0 = c0min; c0 <= c0max; c0++)
		for (c1 = c1min; c1 <= c1max; c1++) {
			histp = &histogram[c0][c1][c2min];
			for (c2 = c2min; c2 <= c2max; c2++, histp++)
				if (*histp != 0) {
					ccount++;
				}
		}
	boxp->colorcount = ccount;
}